

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::logBuild
          (CLIntercept *this,time_point buildTimeStart,cl_program program,cl_uint numDevices,
          cl_device_id *deviceList)

{
  double dVar1;
  uint uVar2;
  SConfig *pSVar3;
  cl_icd_dispatch *pcVar4;
  uint in_ECX;
  cl_program in_RDX;
  CLIntercept *in_RDI;
  void *in_R8;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float __x;
  char *buildLog;
  size_t buildLogSize;
  string message;
  char str [256];
  char *deviceOpenCLCVersion;
  char *deviceName;
  cl_build_status buildStatus;
  cl_uint i;
  float buildTimeMS;
  char numberString [256];
  SProgramInfo *programInfo;
  cl_int errorCode;
  cl_device_id *localDeviceList;
  lock_guard<std::mutex> lock;
  duration<float,_std::ratio<1L,_1000L>_> buildDuration;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  lock_guard<std::mutex> *in_stack_fffffffffffffbc0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffbc8;
  duration<float,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffbd0;
  allocator *paVar5;
  cl_device_id **in_stack_fffffffffffffbd8;
  cl_device_id p_Var6;
  cl_uint *in_stack_fffffffffffffbe0;
  allocator *in_stack_fffffffffffffbe8;
  CLIntercept *in_stack_fffffffffffffbf0;
  cl_device_id in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  uint in_stack_fffffffffffffc04;
  CEnumNameMap *in_stack_fffffffffffffc08;
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [32];
  cl_device_id local_2f0;
  size_t local_2e8;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [32];
  char local_298 [88];
  size_t in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  cl_device_id in_stack_fffffffffffffdd0;
  cl_program in_stack_fffffffffffffdd8;
  CLIntercept *in_stack_fffffffffffffde0;
  undefined4 local_184;
  uint local_180;
  rep_conflict local_17c;
  char local_178 [264];
  mapped_type *local_70;
  uint local_54;
  void *local_50;
  undefined8 local_40;
  rep local_38;
  duration<float,_std::ratio<1L,_1000L>_> local_2c;
  void *local_28;
  uint local_1c;
  cl_program local_18;
  
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_40 = std::chrono::_V2::steady_clock::now();
  local_38 = (rep)std::chrono::operator-
                            (in_stack_fffffffffffffbc8,
                             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffffbc0);
  std::chrono::duration<float,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_fffffffffffffbd0,&in_stack_fffffffffffffbc8->__d);
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_fffffffffffffbc0,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  local_50 = (void *)0x0;
  local_54 = 0;
  if ((local_28 == (void *)0x0) &&
     (local_54 = allocateAndGetProgramDeviceList
                           (in_stack_fffffffffffffbf0,(cl_program)in_stack_fffffffffffffbe8,
                            in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8), local_54 == 0)) {
    local_28 = local_50;
  }
  if ((((in_RDI->m_Config).BuildLogging & 1U) != 0) && (local_54 == 0)) {
    local_70 = std::
               map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
               ::operator[]((map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                            (key_type *)in_stack_fffffffffffffbf8);
    local_178[0xf0] = '\0';
    local_178[0xf1] = '\0';
    local_178[0xf2] = '\0';
    local_178[0xf3] = '\0';
    local_178[0xf4] = '\0';
    local_178[0xf5] = '\0';
    local_178[0xf6] = '\0';
    local_178[0xf7] = '\0';
    local_178[0xf8] = '\0';
    local_178[0xf9] = '\0';
    local_178[0xfa] = '\0';
    local_178[0xfb] = '\0';
    local_178[0xfc] = '\0';
    local_178[0xfd] = '\0';
    local_178[0xfe] = '\0';
    local_178[0xff] = '\0';
    local_178[0xe0] = '\0';
    local_178[0xe1] = '\0';
    local_178[0xe2] = '\0';
    local_178[0xe3] = '\0';
    local_178[0xe4] = '\0';
    local_178[0xe5] = '\0';
    local_178[0xe6] = '\0';
    local_178[0xe7] = '\0';
    local_178[0xe8] = '\0';
    local_178[0xe9] = '\0';
    local_178[0xea] = '\0';
    local_178[0xeb] = '\0';
    local_178[0xec] = '\0';
    local_178[0xed] = '\0';
    local_178[0xee] = '\0';
    local_178[0xef] = '\0';
    local_178[0xd0] = '\0';
    local_178[0xd1] = '\0';
    local_178[0xd2] = '\0';
    local_178[0xd3] = '\0';
    local_178[0xd4] = '\0';
    local_178[0xd5] = '\0';
    local_178[0xd6] = '\0';
    local_178[0xd7] = '\0';
    local_178[0xd8] = '\0';
    local_178[0xd9] = '\0';
    local_178[0xda] = '\0';
    local_178[0xdb] = '\0';
    local_178[0xdc] = '\0';
    local_178[0xdd] = '\0';
    local_178[0xde] = '\0';
    local_178[0xdf] = '\0';
    local_178[0xc0] = '\0';
    local_178[0xc1] = '\0';
    local_178[0xc2] = '\0';
    local_178[0xc3] = '\0';
    local_178[0xc4] = '\0';
    local_178[0xc5] = '\0';
    local_178[0xc6] = '\0';
    local_178[199] = '\0';
    local_178[200] = '\0';
    local_178[0xc9] = '\0';
    local_178[0xca] = '\0';
    local_178[0xcb] = '\0';
    local_178[0xcc] = '\0';
    local_178[0xcd] = '\0';
    local_178[0xce] = '\0';
    local_178[0xcf] = '\0';
    local_178[0xb0] = '\0';
    local_178[0xb1] = '\0';
    local_178[0xb2] = '\0';
    local_178[0xb3] = '\0';
    local_178[0xb4] = '\0';
    local_178[0xb5] = '\0';
    local_178[0xb6] = '\0';
    local_178[0xb7] = '\0';
    local_178[0xb8] = '\0';
    local_178[0xb9] = '\0';
    local_178[0xba] = '\0';
    local_178[0xbb] = '\0';
    local_178[0xbc] = '\0';
    local_178[0xbd] = '\0';
    local_178[0xbe] = '\0';
    local_178[0xbf] = '\0';
    local_178[0xa0] = '\0';
    local_178[0xa1] = '\0';
    local_178[0xa2] = '\0';
    local_178[0xa3] = '\0';
    local_178[0xa4] = '\0';
    local_178[0xa5] = '\0';
    local_178[0xa6] = '\0';
    local_178[0xa7] = '\0';
    local_178[0xa8] = '\0';
    local_178[0xa9] = '\0';
    local_178[0xaa] = '\0';
    local_178[0xab] = '\0';
    local_178[0xac] = '\0';
    local_178[0xad] = '\0';
    local_178[0xae] = '\0';
    local_178[0xaf] = '\0';
    local_178[0x90] = '\0';
    local_178[0x91] = '\0';
    local_178[0x92] = '\0';
    local_178[0x93] = '\0';
    local_178[0x94] = '\0';
    local_178[0x95] = '\0';
    local_178[0x96] = '\0';
    local_178[0x97] = '\0';
    local_178[0x98] = '\0';
    local_178[0x99] = '\0';
    local_178[0x9a] = '\0';
    local_178[0x9b] = '\0';
    local_178[0x9c] = '\0';
    local_178[0x9d] = '\0';
    local_178[0x9e] = '\0';
    local_178[0x9f] = '\0';
    local_178[0x80] = '\0';
    local_178[0x81] = '\0';
    local_178[0x82] = '\0';
    local_178[0x83] = '\0';
    local_178[0x84] = '\0';
    local_178[0x85] = '\0';
    local_178[0x86] = '\0';
    local_178[0x87] = '\0';
    local_178[0x88] = '\0';
    local_178[0x89] = '\0';
    local_178[0x8a] = '\0';
    local_178[0x8b] = '\0';
    local_178[0x8c] = '\0';
    local_178[0x8d] = '\0';
    local_178[0x8e] = '\0';
    local_178[0x8f] = '\0';
    local_178[0x70] = '\0';
    local_178[0x71] = '\0';
    local_178[0x72] = '\0';
    local_178[0x73] = '\0';
    local_178[0x74] = '\0';
    local_178[0x75] = '\0';
    local_178[0x76] = '\0';
    local_178[0x77] = '\0';
    local_178[0x78] = '\0';
    local_178[0x79] = '\0';
    local_178[0x7a] = '\0';
    local_178[0x7b] = '\0';
    local_178[0x7c] = '\0';
    local_178[0x7d] = '\0';
    local_178[0x7e] = '\0';
    local_178[0x7f] = '\0';
    local_178[0x60] = '\0';
    local_178[0x61] = '\0';
    local_178[0x62] = '\0';
    local_178[99] = '\0';
    local_178[100] = '\0';
    local_178[0x65] = '\0';
    local_178[0x66] = '\0';
    local_178[0x67] = '\0';
    local_178[0x68] = '\0';
    local_178[0x69] = '\0';
    local_178[0x6a] = '\0';
    local_178[0x6b] = '\0';
    local_178[0x6c] = '\0';
    local_178[0x6d] = '\0';
    local_178[0x6e] = '\0';
    local_178[0x6f] = '\0';
    local_178[0x50] = '\0';
    local_178[0x51] = '\0';
    local_178[0x52] = '\0';
    local_178[0x53] = '\0';
    local_178[0x54] = '\0';
    local_178[0x55] = '\0';
    local_178[0x56] = '\0';
    local_178[0x57] = '\0';
    local_178[0x58] = '\0';
    local_178[0x59] = '\0';
    local_178[0x5a] = '\0';
    local_178[0x5b] = '\0';
    local_178[0x5c] = '\0';
    local_178[0x5d] = '\0';
    local_178[0x5e] = '\0';
    local_178[0x5f] = '\0';
    local_178[0x40] = '\0';
    local_178[0x41] = '\0';
    local_178[0x42] = '\0';
    local_178[0x43] = '\0';
    local_178[0x44] = '\0';
    local_178[0x45] = '\0';
    local_178[0x46] = '\0';
    local_178[0x47] = '\0';
    local_178[0x48] = '\0';
    local_178[0x49] = '\0';
    local_178[0x4a] = '\0';
    local_178[0x4b] = '\0';
    local_178[0x4c] = '\0';
    local_178[0x4d] = '\0';
    local_178[0x4e] = '\0';
    local_178[0x4f] = '\0';
    local_178[0x30] = '\0';
    local_178[0x31] = '\0';
    local_178[0x32] = '\0';
    local_178[0x33] = '\0';
    local_178[0x34] = '\0';
    local_178[0x35] = '\0';
    local_178[0x36] = '\0';
    local_178[0x37] = '\0';
    local_178[0x38] = '\0';
    local_178[0x39] = '\0';
    local_178[0x3a] = '\0';
    local_178[0x3b] = '\0';
    local_178[0x3c] = '\0';
    local_178[0x3d] = '\0';
    local_178[0x3e] = '\0';
    local_178[0x3f] = '\0';
    local_178[0x20] = '\0';
    local_178[0x21] = '\0';
    local_178[0x22] = '\0';
    local_178[0x23] = '\0';
    local_178[0x24] = '\0';
    local_178[0x25] = '\0';
    local_178[0x26] = '\0';
    local_178[0x27] = '\0';
    local_178[0x28] = '\0';
    local_178[0x29] = '\0';
    local_178[0x2a] = '\0';
    local_178[0x2b] = '\0';
    local_178[0x2c] = '\0';
    local_178[0x2d] = '\0';
    local_178[0x2e] = '\0';
    local_178[0x2f] = '\0';
    local_178[0x10] = '\0';
    local_178[0x11] = '\0';
    local_178[0x12] = '\0';
    local_178[0x13] = '\0';
    local_178[0x14] = '\0';
    local_178[0x15] = '\0';
    local_178[0x16] = '\0';
    local_178[0x17] = '\0';
    local_178[0x18] = '\0';
    local_178[0x19] = '\0';
    local_178[0x1a] = '\0';
    local_178[0x1b] = '\0';
    local_178[0x1c] = '\0';
    local_178[0x1d] = '\0';
    local_178[0x1e] = '\0';
    local_178[0x1f] = '\0';
    local_178[0] = '\0';
    local_178[1] = '\0';
    local_178[2] = '\0';
    local_178[3] = '\0';
    local_178[4] = '\0';
    local_178[5] = '\0';
    local_178[6] = '\0';
    local_178[7] = '\0';
    local_178[8] = '\0';
    local_178[9] = '\0';
    local_178[10] = '\0';
    local_178[0xb] = '\0';
    local_178[0xc] = '\0';
    local_178[0xd] = '\0';
    local_178[0xe] = '\0';
    local_178[0xf] = '\0';
    pSVar3 = config(in_RDI);
    if ((pSVar3->OmitProgramNumber & 1U) == 0) {
      snprintf(local_178,0x100,"%04u_%08X_%04u_%08X",(ulong)local_70->ProgramNumber,
               local_70->ProgramHash & 0xffffffff,(ulong)local_70->CompileCount,
               (int)local_70->OptionsHash);
      __x = extraout_XMM0_Da_00;
    }
    else {
      snprintf(local_178,0x100,"%08X_%04u_%08X",local_70->ProgramHash & 0xffffffff,
               (ulong)local_70->CompileCount,local_70->OptionsHash & 0xffffffff);
      __x = extraout_XMM0_Da;
    }
    logf(in_RDI,__x);
    local_17c = std::chrono::duration<float,_std::ratio<1L,_1000L>_>::count(&local_2c);
    logf(in_RDI,SUB84((double)local_17c,0));
  }
  if (local_54 == 0) {
    for (local_180 = 0; local_180 < local_1c; local_180 = local_180 + 1) {
      if (((in_RDI->m_Config).BuildLogging & 1U) != 0) {
        local_184 = 0xffffffff;
        pcVar4 = dispatch(in_RDI);
        local_54 = (*pcVar4->clGetProgramBuildInfo)
                             (local_18,*(cl_device_id *)((long)local_28 + (ulong)local_180 * 8),
                              0x1181,4,&local_184,(size_t *)0x0);
        if (local_54 == 0) {
          local_54 = allocateAndGetDeviceInfoString
                               ((CLIntercept *)
                                CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                                in_stack_fffffffffffffbf8,
                                (cl_device_info)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
                                (char **)in_stack_fffffffffffffbe8);
          uVar2 = allocateAndGetDeviceInfoString
                            ((CLIntercept *)
                             CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                             in_stack_fffffffffffffbf8,
                             (cl_device_info)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
                             (char **)in_stack_fffffffffffffbe8);
          local_54 = local_54 | uVar2;
          in_stack_fffffffffffffdd8 = (cl_program)0x0;
          in_stack_fffffffffffffde0 = (CLIntercept *)0x0;
          in_stack_fffffffffffffdc8 = (char *)0x0;
          in_stack_fffffffffffffdd0 = (cl_device_id)0x0;
          local_298[0x50] = '\0';
          local_298[0x51] = '\0';
          local_298[0x52] = '\0';
          local_298[0x53] = '\0';
          local_298[0x54] = '\0';
          local_298[0x55] = '\0';
          local_298[0x56] = '\0';
          local_298[0x57] = '\0';
          in_stack_fffffffffffffdc0 = 0;
          local_298[0x40] = '\0';
          local_298[0x41] = '\0';
          local_298[0x42] = '\0';
          local_298[0x43] = '\0';
          local_298[0x44] = '\0';
          local_298[0x45] = '\0';
          local_298[0x46] = '\0';
          local_298[0x47] = '\0';
          local_298[0x48] = '\0';
          local_298[0x49] = '\0';
          local_298[0x4a] = '\0';
          local_298[0x4b] = '\0';
          local_298[0x4c] = '\0';
          local_298[0x4d] = '\0';
          local_298[0x4e] = '\0';
          local_298[0x4f] = '\0';
          local_298[0x30] = '\0';
          local_298[0x31] = '\0';
          local_298[0x32] = '\0';
          local_298[0x33] = '\0';
          local_298[0x34] = '\0';
          local_298[0x35] = '\0';
          local_298[0x36] = '\0';
          local_298[0x37] = '\0';
          local_298[0x38] = '\0';
          local_298[0x39] = '\0';
          local_298[0x3a] = '\0';
          local_298[0x3b] = '\0';
          local_298[0x3c] = '\0';
          local_298[0x3d] = '\0';
          local_298[0x3e] = '\0';
          local_298[0x3f] = '\0';
          local_298[0x20] = '\0';
          local_298[0x21] = '\0';
          local_298[0x22] = '\0';
          local_298[0x23] = '\0';
          local_298[0x24] = '\0';
          local_298[0x25] = '\0';
          local_298[0x26] = '\0';
          local_298[0x27] = '\0';
          local_298[0x28] = '\0';
          local_298[0x29] = '\0';
          local_298[0x2a] = '\0';
          local_298[0x2b] = '\0';
          local_298[0x2c] = '\0';
          local_298[0x2d] = '\0';
          local_298[0x2e] = '\0';
          local_298[0x2f] = '\0';
          local_298[0x10] = '\0';
          local_298[0x11] = '\0';
          local_298[0x12] = '\0';
          local_298[0x13] = '\0';
          local_298[0x14] = '\0';
          local_298[0x15] = '\0';
          local_298[0x16] = '\0';
          local_298[0x17] = '\0';
          local_298[0x18] = '\0';
          local_298[0x19] = '\0';
          local_298[0x1a] = '\0';
          local_298[0x1b] = '\0';
          local_298[0x1c] = '\0';
          local_298[0x1d] = '\0';
          local_298[0x1e] = '\0';
          local_298[0x1f] = '\0';
          local_298[0] = '\0';
          local_298[1] = '\0';
          local_298[2] = '\0';
          local_298[3] = '\0';
          local_298[4] = '\0';
          local_298[5] = '\0';
          local_298[6] = '\0';
          local_298[7] = '\0';
          local_298[8] = '\0';
          local_298[9] = '\0';
          local_298[10] = '\0';
          local_298[0xb] = '\0';
          local_298[0xc] = '\0';
          local_298[0xd] = '\0';
          local_298[0xe] = '\0';
          local_298[0xf] = '\0';
          snprintf(local_298,0x100,"Build Status for device %u = ",(ulong)local_180);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2b8,local_298,&local_2b9);
          std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
          if (local_54 == 0) {
            std::__cxx11::string::operator+=(local_2b8,(char *)0x0);
            std::__cxx11::string::operator+=(local_2b8," (");
            std::__cxx11::string::operator+=(local_2b8,(char *)0x0);
            std::__cxx11::string::operator+=(local_2b8,"): ");
          }
          enumName(in_RDI);
          CEnumNameMap::name_build_status_abi_cxx11_
                    (in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
          std::__cxx11::string::operator+=(local_2b8,local_2e0);
          std::__cxx11::string::~string(local_2e0);
          dVar1 = (double)std::__cxx11::string::operator+=(local_2b8,"\n");
          log(in_RDI,dVar1);
          std::__cxx11::string::~string(local_2b8);
        }
      }
      local_2e8 = 0;
      in_stack_fffffffffffffc08 = (CEnumNameMap *)dispatch(in_RDI);
      in_stack_fffffffffffffc04 =
           (*(code *)(in_stack_fffffffffffffc08->m_cl_command_queue_capabilities_intel)._M_t._M_impl
                     .super__Rb_tree_header._M_header._M_left)
                     (local_18,*(undefined8 *)((long)local_28 + (ulong)local_180 * 8),0x1183,0,0,
                      &local_2e8);
      local_54 = in_stack_fffffffffffffc04;
      if ((in_stack_fffffffffffffc04 == 0) &&
         (in_stack_fffffffffffffbf8 = (cl_device_id)operator_new__(local_2e8 + 1),
         local_2f0 = in_stack_fffffffffffffbf8, in_stack_fffffffffffffbf8 != (cl_device_id)0x0)) {
        in_stack_fffffffffffffbf0 = (CLIntercept *)dispatch(in_RDI);
        (*(in_stack_fffffffffffffbf0->m_Dispatch).clCreateProgramWithSource)
                  (local_18,*(cl_device_id *)((long)local_28 + (ulong)local_180 * 8),0x1183,
                   local_2e8,local_2f0,(size_t *)0x0);
        if (local_2f0[local_2e8 - 1] == (_cl_device_id)0x0) {
          local_2e8 = local_2e8 - 1;
        }
        else {
          local_2f0[local_2e8] = (_cl_device_id)0x0;
        }
        if (((in_RDI->m_Config).BuildLogging & 1U) != 0) {
          in_stack_fffffffffffffbe8 = &local_311;
          std::allocator<char>::allocator();
          dVar1 = (double)std::__cxx11::string::string
                                    (local_310,"-------> Start of Build Log:\n",
                                     in_stack_fffffffffffffbe8);
          log(in_RDI,dVar1);
          std::__cxx11::string::~string(local_310);
          std::allocator<char>::~allocator((allocator<char> *)&local_311);
          paVar5 = &local_339;
          p_Var6 = local_2f0;
          std::allocator<char>::allocator();
          dVar1 = (double)std::__cxx11::string::string(local_338,(char *)p_Var6,paVar5);
          log(in_RDI,dVar1);
          std::__cxx11::string::~string(local_338);
          std::allocator<char>::~allocator((allocator<char> *)&local_339);
          paVar5 = &local_361;
          std::allocator<char>::allocator();
          dVar1 = (double)std::__cxx11::string::string
                                    (local_360,"<------- End of Build Log\n\n",paVar5);
          log(in_RDI,dVar1);
          std::__cxx11::string::~string(local_360);
          std::allocator<char>::~allocator((allocator<char> *)&local_361);
        }
        if (((in_RDI->m_Config).DumpProgramBuildLogs & 1U) != 0) {
          dumpProgramBuildLog(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                              in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                              in_stack_fffffffffffffdc0);
        }
        if (local_2f0 != (cl_device_id)0x0) {
          operator_delete__(local_2f0);
        }
      }
    }
  }
  if (local_50 != (void *)0x0) {
    operator_delete__(local_50);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f4b4a);
  return;
}

Assistant:

void CLIntercept::logBuild(
    clock::time_point buildTimeStart,
    const cl_program program,
    cl_uint numDevices,
    const cl_device_id* deviceList )
{
    std::chrono::duration<float, std::milli>    buildDuration =
        clock::now() - buildTimeStart;

    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_device_id*   localDeviceList = NULL;

    cl_int  errorCode = CL_SUCCESS;

    // There are two possibilities.  Either the device_list is NULL, in which
    // case we need to get the build log for all devices, or it's non-NULL,
    // in which case we only need to get the build log for all devices in
    // the device list.

    if( ( errorCode == CL_SUCCESS ) &&
        ( deviceList == NULL ) )
    {
        errorCode = allocateAndGetProgramDeviceList(
            program,
            numDevices,
            localDeviceList );
        if( errorCode == CL_SUCCESS )
        {
            deviceList = localDeviceList;
        }
    }

    if( m_Config.BuildLogging &&
        errorCode == CL_SUCCESS )
    {
        const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

        char    numberString[256] = "";
        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( numberString, 256, "%08X_%04u_%08X",
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }
        else
        {
            CLI_SPRINTF( numberString, 256, "%04u_%08X_%04u_%08X",
                programInfo.ProgramNumber,
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }

        logf( "Build Info for program %p (%s) for %u device(s):\n",
            program,
            numberString,
            numDevices );

        float   buildTimeMS = buildDuration.count();
        logf( "    Build finished in %.2f ms.\n", buildTimeMS );
    }

    if( errorCode == CL_SUCCESS )
    {
        for( cl_uint i = 0; i < numDevices; i++ )
        {
            if( m_Config.BuildLogging )
            {
                cl_build_status buildStatus = CL_BUILD_NONE;
                errorCode = dispatch().clGetProgramBuildInfo(
                    program,
                    deviceList[ i ],
                    CL_PROGRAM_BUILD_STATUS,
                    sizeof( buildStatus ),
                    &buildStatus,
                    NULL );

                if( errorCode == CL_SUCCESS )
                {
                    char*   deviceName = NULL;
                    char*   deviceOpenCLCVersion = NULL;
                    errorCode = allocateAndGetDeviceInfoString(
                        deviceList[i],
                        CL_DEVICE_NAME,
                        deviceName );
                    errorCode |= allocateAndGetDeviceInfoString(
                        deviceList[i],
                        CL_DEVICE_OPENCL_C_VERSION,
                        deviceOpenCLCVersion );

                    char    str[256] = "";

                    CLI_SPRINTF( str, 256, "Build Status for device %u = ", i );

                    std::string message = str;

                    if( errorCode == CL_SUCCESS )
                    {
                        message += deviceName;
                        message += " (";
                        message += deviceOpenCLCVersion;
                        message += "): ";
                    }

                    message += enumName().name_build_status( buildStatus );
                    message += "\n";

                    log( message );

                    delete [] deviceName;
                    deviceName = NULL;

                    delete [] deviceOpenCLCVersion;
                    deviceOpenCLCVersion = NULL;
                }
            }

            size_t  buildLogSize = 0;
            errorCode = dispatch().clGetProgramBuildInfo(
                program,
                deviceList[ i ],
                CL_PROGRAM_BUILD_LOG,
                0,
                NULL,
                &buildLogSize );

            if( errorCode == CL_SUCCESS )
            {
                char*   buildLog = new char[ buildLogSize + 1 ];
                if( buildLog )
                {
                    dispatch().clGetProgramBuildInfo(
                        program,
                        deviceList[ i ],
                        CL_PROGRAM_BUILD_LOG,
                        buildLogSize,
                        buildLog,
                        NULL );

                    // Check if the build log is already null-terminated.
                    // If it is, we're good, otherwise null terminate it.
                    if( buildLog[ buildLogSize - 1 ] == '\0' )
                    {
                        buildLogSize--;
                    }
                    else
                    {
                        buildLog[ buildLogSize ] = '\0';
                    }

                    if( m_Config.BuildLogging )
                    {
                        log( "-------> Start of Build Log:\n" );
                        log( std::string(buildLog) );
                        log( "<------- End of Build Log\n\n" );
                    }
                    if( m_Config.DumpProgramBuildLogs )
                    {
                        dumpProgramBuildLog(
                            program,
                            deviceList[ i ],
                            buildLog,
                            buildLogSize );
                    }

                    delete [] buildLog;
                }
            }
        }
    }

    delete [] localDeviceList;
}